

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

MPP_RET dec_vproc_set_mode(MppDecVprocCtx ctx,MppVprocMode mode)

{
  if (ctx != (MppDecVprocCtx)0x0) {
    *(MppVprocMode *)((long)ctx + 200) = mode;
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_dec_vproc","found NULL input\n","dec_vproc_set_mode");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET dec_vproc_set_mode(MppDecVprocCtx ctx, MppVprocMode mode)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppDecVprocCtxImpl *p = (MppDecVprocCtxImpl *)ctx;
    p->vproc_mode = mode;
    return MPP_OK;
}